

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void yang_print_typedef(lyout *out,int level,lys_module *module,lys_tpdf *tpdf)

{
  int iVar1;
  char *pcVar2;
  char *__s;
  int level_00;
  
  ly_print(out,"%*stypedef %s {\n");
  level_00 = level + 1;
  if (tpdf->ext_size != 0) {
    yang_print_extension_instances
              (out,level_00,module,LYEXT_SUBSTMT_SELF,'\0',tpdf->ext,(uint)tpdf->ext_size);
  }
  yang_print_type(out,level_00,module,&tpdf->type);
  if (tpdf->units != (char *)0x0) {
    yang_print_substmt(out,level_00,LYEXT_SUBSTMT_UNITS,'\0',tpdf->units,module,tpdf->ext,
                       (uint)tpdf->ext_size);
  }
  __s = tpdf->dflt;
  if (__s != (char *)0x0) {
    if ((tpdf->flags & 0x800) != 0) {
      pcVar2 = strchr(__s,0x3a);
      if (pcVar2 == (char *)0x0) {
        __assert_fail("strchr(tpdf->dflt, \':\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yang.c"
                      ,0x374,
                      "void yang_print_typedef(struct lyout *, int, const struct lys_module *, const struct lys_tpdf *)"
                     );
      }
      iVar1 = strncmp(__s,module->name,(long)pcVar2 - (long)__s);
      if (iVar1 == 0) {
        __s = lydict_insert(module->ctx,pcVar2 + 1,0);
      }
      else {
        __s = transform_json2schema(module,__s);
      }
    }
    yang_print_substmt(out,level_00,LYEXT_SUBSTMT_DEFAULT,'\0',__s,module,tpdf->ext,
                       (uint)tpdf->ext_size);
    if ((tpdf->flags & 0x800) != 0) {
      lydict_remove(module->ctx,__s);
    }
  }
  yang_print_snode_common(out,level_00,(lys_node *)tpdf,module,(int *)0x0,0x70);
  ly_print(out,"%*s}\n",(ulong)(uint)(level * 2),"");
  return;
}

Assistant:

static void
yang_print_typedef(struct lyout *out, int level, const struct lys_module *module, const struct lys_tpdf *tpdf)
{
    const char *dflt;

    ly_print(out, "%*stypedef %s {\n", LEVEL, INDENT, tpdf->name);
    level++;

    yang_print_snode_common(out, level, (struct lys_node *)tpdf, module, NULL, SNODE_COMMON_EXT);
    yang_print_type(out, level, module, &tpdf->type);
    if (tpdf->units != NULL) {
        yang_print_substmt(out, level, LYEXT_SUBSTMT_UNITS, 0, tpdf->units, module, tpdf->ext, tpdf->ext_size);
    }
    if (tpdf->dflt != NULL) {
        if (tpdf->flags & LYS_DFLTJSON) {
            assert(strchr(tpdf->dflt, ':'));
            if (!strncmp(tpdf->dflt, module->name, strchr(tpdf->dflt, ':') - tpdf->dflt)) {
                /* local module */
                dflt = lydict_insert(module->ctx, strchr(tpdf->dflt, ':') + 1, 0);
            } else {
                dflt = transform_json2schema(module, tpdf->dflt);
            }
        } else {
            dflt = tpdf->dflt;
        }
        yang_print_substmt(out, level, LYEXT_SUBSTMT_DEFAULT, 0, dflt, module, tpdf->ext, tpdf->ext_size);
        if (tpdf->flags & LYS_DFLTJSON) {
            lydict_remove(module->ctx, dflt);
        }
    }
    yang_print_snode_common(out, level, (struct lys_node *)tpdf, module, NULL,
                            SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);

    level--;
    ly_print(out, "%*s}\n", LEVEL, INDENT);
}